

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O0

bool __thiscall
Imath_3_2::FrustumTest<float>::completelyContains
          (FrustumTest<float> *this,Box<Imath_3_2::Vec3<float>_> *box)

{
  bool bVar1;
  Box<Imath_3_2::Vec3<float>_> *in_RSI;
  Vec3<float> d1;
  Vec3<float> d0;
  Vec3<float> extent;
  Vec3<float> center;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  Vec3<float> *in_stack_fffffffffffffea8;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined1 local_1;
  
  bVar1 = Box<Imath_3_2::Vec3<float>_>::isEmpty(in_RSI);
  if (bVar1) {
    local_1 = false;
  }
  else {
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator/(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator-
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
    Vec3<float>::operator+
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Vec3<float>::operator-
              (in_stack_fffffffffffffea8,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    if (((0.0 <= local_48) || (0.0 <= local_44)) || (0.0 <= local_40)) {
      local_1 = false;
    }
    else {
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator+
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator+
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator+
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator+
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Vec3<float>::operator*(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
      Vec3<float>::operator+
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Vec3<float>::operator-
                (in_stack_fffffffffffffea8,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (((0.0 <= local_d8) || (0.0 <= local_d4)) || (0.0 <= local_d0)) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool
FrustumTest<T>::completelyContains (const Box<Vec3<T>>& box) const
    IMATH_NOEXCEPT
{
    if (box.isEmpty ()) return false;

    Vec3<T> center = (box.min + box.max) / 2;
    Vec3<T> extent = (box.max - center);

    // This is a vertical dot-product on three vectors at once.
    Vec3<T> d0 = planeNormX[0] * center.x + planeNormY[0] * center.y +
                 planeNormZ[0] * center.z + planeNormAbsX[0] * extent.x +
                 planeNormAbsY[0] * extent.y + planeNormAbsZ[0] * extent.z -
                 planeOffsetVec[0];

    if (d0.x >= 0 || d0.y >= 0 || d0.z >= 0) return false;

    Vec3<T> d1 = planeNormX[1] * center.x + planeNormY[1] * center.y +
                 planeNormZ[1] * center.z + planeNormAbsX[1] * extent.x +
                 planeNormAbsY[1] * extent.y + planeNormAbsZ[1] * extent.z -
                 planeOffsetVec[1];

    if (d1.x >= 0 || d1.y >= 0 || d1.z >= 0) return false;

    return true;
}